

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O3

int __thiscall
CVmObjIterIdx::getp_get_next(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  long idx;
  
  if (getp_get_next(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_next();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_next::desc);
  if (iVar3 == 0) {
    pcVar2 = (this->super_CVmObjIter).super_CVmObject.ext_;
    uVar1 = *(uint *)(pcVar2 + 5);
    if (*(uint *)(pcVar2 + 0xd) <= uVar1) {
      err_throw(0x7eb);
    }
    idx = (ulong)uVar1 + 1;
    get_indexed_val(this,idx,retval);
    set_cur_index(this,self,idx);
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_get_next(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the next index, which is one higher than the current index */
    long idx = get_cur_index() + 1;

    /* if the current value is out of range, throw an error */
    if (idx > get_last_valid())
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve the value */
    get_indexed_val(vmg_ idx, retval);

    /* save the current index in our internal state */
    set_cur_index(vmg_ self, idx);

    /* handled */
    return TRUE;
}